

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

ssize_t __thiscall
ritobin::io::impl_binary_read::BinaryReader::read
          (BinaryReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort *puVar1;
  ushort uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  puVar1 = (ushort *)((long)this->cur_ + 2);
  if (puVar1 <= this->cap_) {
    uVar2 = *(ushort *)this->cur_;
    this->cur_ = (char *)puVar1;
    if (this->cur_ + uVar2 <= this->cap_) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_register_00000034,__fd),&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        pbVar3 = extraout_RAX;
      }
      this->cur_ = this->cur_ + uVar2;
      return CONCAT71((int7)((ulong)pbVar3 >> 8),1);
    }
  }
  return 0;
}

Assistant:

bool read(std::string& value) noexcept {
            uint16_t size = {};
            if (!read(size)) {
                return false;
            }
            if (cur_ + size > cap_) {
                return false;
            }
            value = { cur_, size };
            cur_ += size;
            return true;
        }